

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

PhysicalDeviceSelector * __thiscall
vkb::PhysicalDeviceSelector::add_required_extension(PhysicalDeviceSelector *this,char *extension)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,extension,&local_31);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->criteria).required_extensions,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

PhysicalDeviceSelector& PhysicalDeviceSelector::add_required_extension(const char* extension) {
    criteria.required_extensions.push_back(extension);
    return *this;
}